

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SpotLight *
pbrt::SpotLight::Create
          (Transform *renderFromLight,Medium *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  Point3<float> p;
  Point3f def;
  Point3f def_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vector3f z;
  Vector3f delta;
  SpotLight *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined8 in_R9;
  Float FVar4;
  Float FVar5;
  double dVar7;
  Transform *pTVar12;
  undefined8 uVar13;
  undefined1 auVar14 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  double dVar6;
  undefined1 auVar11 [64];
  Tuple3<pbrt::Point3,_float> TVar15;
  Tuple3<pbrt::Point3,_float> TVar16;
  Vector3<float> VVar17;
  Float k_e;
  Float cosFalloffStart;
  Float cosFalloffEnd;
  Float phi_v;
  Transform finalRenderFromLight;
  Transform t;
  Transform dirToZ;
  Point3f to;
  Point3f from;
  Float conedelta;
  Float coneangle;
  Float sc;
  Spectrum I;
  DenselySampledSpectrum *in_stack_fffffffffffff9a8;
  ParameterDictionary *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  Transform *t_00;
  Float *args_4;
  undefined8 in_stack_fffffffffffff9d0;
  float *args_3;
  float in_stack_fffffffffffff9d8;
  Spectrum *args_2;
  allocator<char> *in_stack_fffffffffffff9e0;
  allocator<char> *__a;
  string *in_stack_fffffffffffff9e8;
  ParameterDictionary *in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  float in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  float in_stack_fffffffffffffa10;
  undefined4 uVar18;
  undefined4 uVar19;
  SpectrumType in_stack_fffffffffffffa1c;
  Spectrum *in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  Allocator in_stack_fffffffffffffa38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  float fVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  allocator<char> local_529;
  string local_528 [36];
  float local_504;
  Transform local_500;
  Spectrum local_478 [16];
  undefined8 local_3f8;
  undefined4 local_3f0;
  undefined8 local_3e4;
  undefined4 local_3dc;
  float local_3d8 [32];
  allocator<char> local_358 [128];
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  Transform local_25c;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  allocator<char> local_189;
  string local_188 [32];
  undefined8 local_168;
  float local_160;
  undefined8 local_158;
  float local_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_138;
  undefined4 local_130;
  allocator<char> local_129;
  string local_128 [32];
  undefined8 local_108;
  float local_100;
  allocator<char> local_f9;
  string local_f8 [32];
  Float local_d8;
  allocator<char> local_d1;
  string local_d0 [32];
  float local_b0;
  allocator<char> local_a9;
  string local_a8 [36];
  Float local_84;
  undefined8 local_80;
  allocator<char> local_59;
  string local_58 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 local_8;
  undefined1 auVar8 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_20 = in_RDX;
  local_8 = in_R9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            ((Spectrum *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  local_80 = local_8;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
             in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
             in_stack_fffffffffffffa38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  FVar4 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffff9b0,(string *)in_stack_fffffffffffff9a8,0.0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pbVar22 = local_20;
  local_84 = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  FVar4 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffff9b0,(string *)in_stack_fffffffffffff9a8,0.0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  fVar21 = SUB84(&local_f9,0);
  pbVar20 = local_20;
  local_b0 = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  FVar5 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffff9b0,(string *)in_stack_fffffffffffff9a8,0.0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  local_d8 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffff9b0,
             (float)((ulong)in_stack_fffffffffffff9a8 >> 0x20),SUB84(in_stack_fffffffffffff9a8,0),
             0.0);
  local_140 = local_130;
  local_148 = local_138;
  pTVar12 = (Transform *)0x0;
  def.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa10;
  def.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffa08;
  def.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffa08 >> 0x20);
  TVar15 = (Tuple3<pbrt::Point3,_float>)
           ParameterDictionary::GetOnePoint3f
                     (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,def);
  local_150 = TVar15.z;
  auVar2._8_8_ = pTVar12;
  auVar2._0_8_ = TVar15._0_8_;
  local_158 = vmovlpd_avx(auVar2);
  local_108 = local_158;
  local_100 = local_150;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffff9b0,
             (float)((ulong)in_stack_fffffffffffff9a8 >> 0x20),SUB84(in_stack_fffffffffffff9a8,0),
             0.0);
  local_1a0 = local_190;
  local_1a8 = local_198;
  uVar13 = 0;
  def_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa10;
  def_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffa08;
  def_00.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffa08 >> 0x20);
  TVar16 = (Tuple3<pbrt::Point3,_float>)
           ParameterDictionary::GetOnePoint3f
                     (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,def_00);
  local_1b0 = TVar16.z;
  uVar18 = (undefined4)uVar13;
  uVar19 = (undefined4)((ulong)uVar13 >> 0x20);
  auVar1._8_4_ = uVar18;
  auVar1._0_8_ = TVar16._0_8_;
  auVar1._12_4_ = uVar19;
  local_1b8 = vmovlpd_avx(auVar1);
  local_168 = local_1b8;
  local_160 = local_1b0;
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  local_280 = local_100;
  local_288 = local_108;
  local_290 = local_100;
  local_298 = local_108;
  auVar14 = ZEXT856(0);
  p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff9d8;
  p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff9d0;
  p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffff9d0 >> 0x20);
  VVar17 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
                      ,p);
  local_2b0 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar14;
  local_2b8 = vmovlpd_avx(auVar8._0_16_);
  auVar14 = ZEXT856(0);
  VVar17.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa00;
  VVar17.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff9f8;
  VVar17.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  local_2a8 = local_2b8;
  local_2a0 = local_2b0;
  local_278 = local_2b8;
  local_270 = local_2b0;
  VVar17 = Normalize<float>(VVar17);
  local_2d0 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar14;
  local_2d8 = vmovlpd_avx(auVar9._0_16_);
  t_00 = &local_25c;
  z.super_Tuple3<pbrt::Vector3,_float>.z = fVar21;
  z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pbVar20;
  local_2c8 = local_2d8;
  local_2c0 = local_2d0;
  local_268 = local_2d8;
  local_260 = local_2d0;
  Frame::FromZ(z);
  args_4 = local_25c.m.m[2] + 1;
  Transform::Transform((Transform *)CONCAT44(uVar19,uVar18),TVar16._0_8_);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffff9b0,
             (float)((ulong)in_stack_fffffffffffff9a8 >> 0x20),SUB84(in_stack_fffffffffffff9a8,0),
             0.0);
  local_3f0 = local_3dc;
  local_3f8 = local_3e4;
  args_3 = local_3d8;
  delta.super_Tuple3<pbrt::Vector3,_float>._4_8_ = pbVar22;
  delta.super_Tuple3<pbrt::Vector3,_float>.x = FVar4;
  Translate(delta);
  args_2 = local_478;
  Inverse(t_00);
  __a = local_358;
  Transform::operator*(pTVar12,TVar15._0_8_);
  Transform::operator*(pTVar12,TVar15._0_8_);
  pTVar12 = &local_500;
  Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffff9b0,(Spectrum *)in_stack_fffffffffffff9a8);
  FVar4 = SpectrumToPhotometric((Spectrum *)t_00);
  local_84 = local_84 / FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_20,(char *)pTVar12,__a);
  FVar4 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffff9b0,(string *)in_stack_fffffffffffff9a8,0.0);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  local_504 = FVar4;
  if (0.0 < FVar4) {
    auVar10._0_4_ = Radians(local_b0);
    auVar10._4_60_ = extraout_var;
    dVar6 = std::cos(auVar10._0_8_);
    auVar11._0_4_ = Radians(local_b0 - local_d8);
    auVar11._4_60_ = extraout_var_00;
    dVar7 = std::cos(auVar11._0_8_);
    local_84 = (local_504 /
               (((1.0 - SUB84(dVar7,0)) + (SUB84(dVar7,0) - SUB84(dVar6,0)) / 2.0) * 6.2831855)) *
               local_84;
  }
  pSVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpotLight,pbrt::Transform&,pbrt::Medium&,pbrt::Spectrum&,float&,float&,float>
                     ((polymorphic_allocator<std::byte> *)local_20,pTVar12,(Medium *)__a,args_2,
                      args_3,args_4,(float *)CONCAT44(TVar16.z,in_stack_fffffffffffffa00));
  return pSVar3;
}

Assistant:

SpotLight *SpotLight::Create(const Transform &renderFromLight, Medium medium,
                             const ParameterDictionary &parameters,
                             const RGBColorSpace *colorSpace, const FileLoc *loc,
                             Allocator alloc) {
    Spectrum I = parameters.GetOneSpectrum("I", &colorSpace->illuminant,
                                           SpectrumType::Illuminant, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Float coneangle = parameters.GetOneFloat("coneangle", 30.);
    Float conedelta = parameters.GetOneFloat("conedeltaangle", 5.);
    // Compute spotlight rendering to light transformation
    Point3f from = parameters.GetOnePoint3f("from", Point3f(0, 0, 0));
    Point3f to = parameters.GetOnePoint3f("to", Point3f(0, 0, 1));

    Transform dirToZ = (Transform)Frame::FromZ(Normalize(to - from));
    Transform t = Translate(Vector3f(from.x, from.y, from.z)) * Inverse(dirToZ);
    Transform finalRenderFromLight = renderFromLight * t;

    sc /= SpectrumToPhotometric(I);

    Float phi_v = parameters.GetOneFloat("power", -1);
    if (phi_v > 0) {
        Float cosFalloffEnd = std::cos(Radians(coneangle));
        Float cosFalloffStart = std::cos(Radians(coneangle - conedelta));
        Float k_e =
            2 * Pi * ((1 - cosFalloffStart) + (cosFalloffStart - cosFalloffEnd) / 2);
        sc *= phi_v / k_e;
    }

    return alloc.new_object<SpotLight>(finalRenderFromLight, medium, I, sc, coneangle,
                                       coneangle - conedelta);
}